

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

int __thiscall
QAccessibleMdiArea::indexOfChild(QAccessibleMdiArea *this,QAccessibleInterface *child)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  QMdiSubWindow *pQVar4;
  qsizetype qVar5;
  QMdiArea *in_RSI;
  long in_FS_OFFSET;
  QMdiSubWindow *window;
  QMdiSubWindow **in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar6;
  undefined2 in_stack_ffffffffffffffa4;
  WindowOrder order;
  undefined4 uVar7;
  int local_44;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  order = (WindowOrder)CONCAT12(1,in_stack_ffffffffffffffa4);
  if (in_RSI != (QMdiArea *)0x0) {
    lVar3 = (**(code **)(*(long *)&(in_RSI->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                        0x18))();
    order = CONCAT13((char)(order >> 0x18),CONCAT12(1,(short)order));
    if (lVar3 != 0) {
      mdiArea((QAccessibleMdiArea *)0x7e4634);
      QMdiArea::subWindowList(in_RSI,order);
      uVar7 = CONCAT13(1,(int3)order);
      bVar2 = QList<QMdiSubWindow_*>::isEmpty((QList<QMdiSubWindow_*> *)0x7e4652);
      order = CONCAT13((char)((uint)uVar7 >> 0x18),CONCAT12(bVar2,(short)uVar7));
    }
  }
  uVar6 = CONCAT13((char)(order >> 0x10),(int3)in_stack_ffffffffffffff94);
  if ((order & 0x1000000) != CreationOrder) {
    QList<QMdiSubWindow_*>::~QList((QList<QMdiSubWindow_*> *)0x7e4671);
  }
  if ((uVar6 & 0x1000000) == 0) {
    (**(code **)(*(long *)&(in_RSI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x18))()
    ;
    pQVar4 = qobject_cast<QMdiSubWindow*>((QObject *)0x7e4698);
    if (pQVar4 == (QMdiSubWindow *)0x0) {
      local_44 = -1;
    }
    else {
      mdiArea((QAccessibleMdiArea *)0x7e46af);
      QMdiArea::subWindowList(in_RSI,order);
      qVar5 = QListSpecialMethodsBase<QMdiSubWindow*>::indexOf<QMdiSubWindow*>
                        ((QListSpecialMethodsBase<QMdiSubWindow_*> *)
                         CONCAT44(uVar6,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
                         0x7e46d1);
      local_44 = (int)qVar5;
      QList<QMdiSubWindow_*>::~QList((QList<QMdiSubWindow_*> *)0x7e46df);
    }
  }
  else {
    local_44 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_44;
}

Assistant:

int QAccessibleMdiArea::indexOfChild(const QAccessibleInterface *child) const
{
    if (!child || !child->object() || mdiArea()->subWindowList().isEmpty())
        return -1;
    if (QMdiSubWindow *window = qobject_cast<QMdiSubWindow *>(child->object())) {
        return mdiArea()->subWindowList().indexOf(window);
    }
    return -1;
}